

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

char ** poptGetArgs(poptContext con)

{
  int iVar1;
  
  if ((con != (poptContext)0x0) && (con->leftovers != (poptArgv)0x0)) {
    iVar1 = con->nextLeftover;
    if (con->numLeftovers != iVar1) {
      con->leftovers[con->numLeftovers] = (poptString)0x0;
      return con->leftovers + iVar1;
    }
  }
  return (char **)0x0;
}

Assistant:

const char ** poptGetArgs(poptContext con)
{
    if (con == NULL ||
	con->leftovers == NULL || con->numLeftovers == con->nextLeftover)
	return NULL;

    /* some apps like [like RPM ;-) ] need this NULL terminated */
    con->leftovers[con->numLeftovers] = NULL;

    return (con->leftovers + con->nextLeftover);
}